

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O1

Task * __thiscall
tf::Task::precede<tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>
          (Task *this,Task *tasks,Task *tasks_1,Task *tasks_2,Task *tasks_3,Task *tasks_4,
          Task *tasks_5)

{
  Node *pNVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 uVar5;
  Node *local_50;
  Node *local_48;
  Task *local_40;
  Task *local_38;
  
  pNVar1 = this->_node;
  local_48 = tasks->_node;
  local_40 = tasks_3;
  local_38 = tasks_4;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_48);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_50 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_48->_edges,&local_50);
  pNVar1 = this->_node;
  local_48 = tasks_1->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_48);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_50 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_48->_edges,&local_50);
  pNVar1 = this->_node;
  local_48 = tasks_2->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_48);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_50 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_48->_edges,&local_50);
  pNVar1 = this->_node;
  local_48 = local_40->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_48);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_50 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_48->_edges,&local_50);
  pNVar1 = this->_node;
  local_48 = local_38->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_48);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_50 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_48->_edges,&local_50);
  pNVar1 = this->_node;
  local_48 = tasks_5->_node;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&pNVar1->_edges,&local_48);
  sVar2 = pNVar1->_num_successors;
  pvVar3 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX;
  pNVar1->_num_successors = sVar2 + 1;
  pvVar4 = (pNVar1->_edges).super_SmallVectorImpl<tf::Node_*>.
           super_SmallVectorTemplateBase<tf::Node_*,_true>.
           super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX;
  uVar5 = *(undefined8 *)((long)pvVar3 + sVar2 * 8);
  *(undefined8 *)((long)pvVar3 + sVar2 * 8) = *(undefined8 *)((long)pvVar4 + -8);
  *(undefined8 *)((long)pvVar4 + -8) = uVar5;
  local_50 = pNVar1;
  SmallVectorTemplateBase<tf::Node_*,_true>::push_back
            ((SmallVectorTemplateBase<tf::Node_*,_true> *)&local_48->_edges,&local_50);
  return this;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}